

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilIsop.c
# Opt level: O2

word Abc_Isop6Cover(word uOn,word uOnDc,word *pRes,int nVars,word CostLim,int *pCover)

{
  ulong uVar1;
  int iVar2;
  word Cost0;
  word Cost1;
  word wVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  char *__assertion;
  ulong uVar7;
  int *piVar8;
  ulong uVar9;
  uint uVar10;
  ulong uOnDc_00;
  word uRes2;
  word uRes1;
  word uRes0;
  
  if (nVars < 7) {
    if ((~uOnDc & uOn) == 0) {
      if (uOn == 0) {
        *pRes = 0;
        CostLim = 0;
      }
      else if (uOnDc == 0xffffffffffffffff) {
        CostLim = 0x100000000;
        *pRes = 0xffffffffffffffff;
        if (pCover != (int *)0x0) {
          *pCover = 0;
        }
      }
      else {
        uVar9 = (ulong)(uint)nVars;
        if (nVars < 1) {
          __assertion = "nVars > 0";
          uVar10 = 0x7d;
          goto LAB_003980a8;
        }
        do {
          if ((int)uVar9 < 1) {
            __assert_fail("Var >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                          ,0x82,"word Abc_Isop6Cover(word, word, word *, int, word, int *)");
          }
          uVar10 = (int)uVar9 - 1;
          uVar9 = (ulong)uVar10;
          iVar2 = Abc_Tt6HasVar(uOn,uVar10);
        } while ((iVar2 == 0) && (iVar2 = Abc_Tt6HasVar(uOnDc,uVar10), iVar2 == 0));
        uVar1 = s_Truths6Neg[uVar9];
        bVar4 = (byte)(1 << ((byte)uVar10 & 0x1f));
        uVar9 = s_Truths6[uVar9];
        uVar7 = (uVar1 & uOn) << (bVar4 & 0x3f) | uVar1 & uOn;
        uOnDc_00 = (uVar1 & uOnDc) << (bVar4 & 0x3f) | uVar1 & uOnDc;
        uVar6 = (uOnDc & uVar9) >> (bVar4 & 0x3f) | uOnDc & uVar9;
        Cost0 = Abc_Isop6Cover(~uVar6 & uVar7,uOnDc_00,&uRes0,uVar10,CostLim,pCover);
        if (Cost0 < CostLim) {
          uVar5 = (uVar9 & uOn) >> (bVar4 & 0x3f) | uVar9 & uOn;
          piVar8 = pCover + ((long)Cost0 >> 0x20);
          if (pCover == (int *)0x0) {
            piVar8 = (int *)0x0;
          }
          Cost1 = Abc_Isop6Cover(~uOnDc_00 & uVar5,uVar6,&uRes1,uVar10,CostLim,piVar8);
          if (Cost1 + Cost0 < CostLim) {
            piVar8 = pCover + ((long)Cost0 >> 0x20) + ((long)Cost1 >> 0x20);
            if (pCover == (int *)0x0) {
              piVar8 = (int *)0x0;
            }
            wVar3 = Abc_Isop6Cover(uVar5 & ~uRes1 | uVar7 & ~uRes0,uVar6 & uOnDc_00,&uRes2,uVar10,
                                   CostLim,piVar8);
            uVar6 = wVar3 + Cost1 + Cost0;
            if (uVar6 < CostLim) {
              uVar9 = uRes1 & uVar9 | uRes0 & uVar1 | uRes2;
              *pRes = uVar9;
              if ((uVar9 & ~uOnDc) != 0 || (~uVar9 & uOn) != 0) {
                __assert_fail("(uOn & ~*pRes) == 0 && (*pRes & ~uOnDc) == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                              ,0x91,"word Abc_Isop6Cover(word, word, word *, int, word, int *)");
              }
              Abc_IsopAddLits(pCover,Cost0,Cost1,uVar10);
              CostLim = ((long)Cost1 >> 0x20) + ((long)Cost0 >> 0x20) + uVar6;
            }
          }
        }
      }
      return CostLim;
    }
    __assertion = "(uOn & ~uOnDc) == 0";
    uVar10 = 0x71;
  }
  else {
    __assertion = "nVars <= 6";
    uVar10 = 0x70;
  }
LAB_003980a8:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                ,uVar10,"word Abc_Isop6Cover(word, word, word *, int, word, int *)");
}

Assistant:

word Abc_Isop6Cover( word uOn, word uOnDc, word * pRes, int nVars, word CostLim, int * pCover )
{
    word uOn0, uOn1, uOnDc0, uOnDc1, uRes0, uRes1, uRes2;
    word Cost0, Cost1, Cost2;  int Var; 
    assert( nVars <= 6 );
    assert( (uOn & ~uOnDc) == 0 );
    if ( uOn == 0 )
    {
        pRes[0] = 0;
        return 0;
    }
    if ( uOnDc == ~(word)0 )
    {
        pRes[0] = ~(word)0;
        if ( pCover ) pCover[0] = 0;
        return Abc_Cube2Cost(1);
    }
    assert( nVars > 0 );
    // find the topmost var
    for ( Var = nVars-1; Var >= 0; Var-- )
        if ( Abc_Tt6HasVar( uOn, Var ) || Abc_Tt6HasVar( uOnDc, Var ) )
             break;
    assert( Var >= 0 );
    // cofactor
    uOn0   = Abc_Tt6Cofactor0( uOn,   Var );
    uOn1   = Abc_Tt6Cofactor1( uOn  , Var );
    uOnDc0 = Abc_Tt6Cofactor0( uOnDc, Var );
    uOnDc1 = Abc_Tt6Cofactor1( uOnDc, Var );
    // solve for cofactors
    Cost0 = Abc_Isop6Cover( uOn0 & ~uOnDc1, uOnDc0, &uRes0, Var, CostLim, pCover );
    if ( Cost0 >= CostLim ) return CostLim;
    Cost1 = Abc_Isop6Cover( uOn1 & ~uOnDc0, uOnDc1, &uRes1, Var, CostLim, pCover ? pCover + Abc_CostCubes(Cost0) : NULL );
    if ( Cost0 + Cost1 >= CostLim ) return CostLim;
    Cost2 = Abc_Isop6Cover( (uOn0 & ~uRes0) | (uOn1 & ~uRes1), uOnDc0 & uOnDc1, &uRes2, Var, CostLim, pCover ? pCover + Abc_CostCubes(Cost0) + Abc_CostCubes(Cost1) : NULL );
    if ( Cost0 + Cost1 + Cost2 >= CostLim ) return CostLim;
    // derive the final truth table
    *pRes = uRes2 | (uRes0 & s_Truths6Neg[Var]) | (uRes1 & s_Truths6[Var]);
    assert( (uOn & ~*pRes) == 0 && (*pRes & ~uOnDc) == 0 );
    Abc_IsopAddLits( pCover, Cost0, Cost1, Var );
    return Cost0 + Cost1 + Cost2 + Abc_CostCubes(Cost0) + Abc_CostCubes(Cost1);
}